

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void av1_set_single_tile_decoding_mode(AV1_COMMON *cm)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  
  (cm->tiles).single_tile_decoding = 0;
  if ((cm->tiles).large_scale != 0) {
    if ((cm->lf).filter_level[0] == 0) {
      bVar3 = (cm->lf).filter_level[1] == 0;
    }
    else {
      bVar3 = false;
    }
    uVar1 = 0;
    bVar4 = false;
    if ((cm->cdef_info).cdef_bits == 0) {
      if ((cm->cdef_info).cdef_strengths[0] == 0) {
        bVar4 = (cm->cdef_info).cdef_uv_strengths[0] == 0;
      }
      else {
        bVar4 = false;
      }
    }
    if ((cm->rst_info[0].frame_restoration_type == RESTORE_NONE) &&
       (cm->rst_info[1].frame_restoration_type == RESTORE_NONE)) {
      uVar1 = (uint)(cm->rst_info[2].frame_restoration_type == RESTORE_NONE);
    }
    uVar2 = 0;
    if ((bool)(bVar3 & bVar4)) {
      uVar2 = uVar1;
    }
    (cm->tiles).single_tile_decoding = uVar2;
  }
  return;
}

Assistant:

void av1_set_single_tile_decoding_mode(AV1_COMMON *const cm) {
  cm->tiles.single_tile_decoding = 0;
  if (cm->tiles.large_scale) {
    struct loopfilter *lf = &cm->lf;
    RestorationInfo *const rst_info = cm->rst_info;
    const CdefInfo *const cdef_info = &cm->cdef_info;

    // Figure out single_tile_decoding by loopfilter_level.
    const int no_loopfilter = !(lf->filter_level[0] || lf->filter_level[1]);
    const int no_cdef = cdef_info->cdef_bits == 0 &&
                        cdef_info->cdef_strengths[0] == 0 &&
                        cdef_info->cdef_uv_strengths[0] == 0;
    const int no_restoration =
        rst_info[0].frame_restoration_type == RESTORE_NONE &&
        rst_info[1].frame_restoration_type == RESTORE_NONE &&
        rst_info[2].frame_restoration_type == RESTORE_NONE;
    assert(IMPLIES(cm->features.coded_lossless, no_loopfilter && no_cdef));
    assert(IMPLIES(cm->features.all_lossless, no_restoration));
    cm->tiles.single_tile_decoding = no_loopfilter && no_cdef && no_restoration;
  }
}